

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view.hpp
# Opt level: O1

int __thiscall
pstore::sstring_view<char_const*>::compare<pstore::sstring_view<char_const*>>
          (sstring_view<char_const*> *this,sstring_view<const_char_*> *s)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = s->size_;
  uVar2 = *(ulong *)(this + 8);
  uVar5 = uVar2;
  if (uVar1 < uVar2) {
    uVar5 = uVar1;
  }
  bVar3 = true;
  if (uVar5 == 0) {
    uVar4 = 0;
  }
  else {
    uVar6 = 0;
    uVar4 = 0;
    do {
      if (*(char *)(*(long *)this + uVar6) < s->ptr_[uVar6]) {
        uVar4 = 0xffffffff;
LAB_0017462a:
        bVar3 = false;
        break;
      }
      if (s->ptr_[uVar6] < *(char *)(*(long *)this + uVar6)) {
        uVar4 = 1;
        goto LAB_0017462a;
      }
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  if ((bVar3) && (uVar4 = 0, uVar2 != uVar1)) {
    uVar4 = -(uint)(uVar2 < uVar1) | 1;
  }
  return uVar4;
}

Assistant:

size_type length () const noexcept { return size_; }